

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<const_kj::String>::operator==
          (ArrayPtr<const_kj::String> *this,ArrayPtr<const_kj::String> *other)

{
  bool bVar1;
  String *this_00;
  String *value;
  StringPtr local_38;
  ulong local_28;
  size_t i;
  ArrayPtr<const_kj::String> *other_local;
  ArrayPtr<const_kj::String> *this_local;
  
  if (this->size_ == other->size_) {
    i = (size_t)other;
    other_local = this;
    for (local_28 = 0; local_28 < this->size_; local_28 = local_28 + 1) {
      this_00 = this->ptr + local_28;
      value = operator[]((ArrayPtr<const_kj::String> *)i,local_28);
      StringPtr::StringPtr(&local_38,value);
      bVar1 = String::operator!=(this_00,&local_38);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }